

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O0

bool vera::containsValue(vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         *_points,vec3 *_point)

{
  length_type lVar1;
  size_type sVar2;
  reference v1;
  int local_24;
  int i;
  vec3 *_point_local;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *_points_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ::size(_points);
    if (sVar2 <= (ulong)(long)local_24) {
      return false;
    }
    v1 = std::
         vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ::at(_points,(long)local_24);
    glm::operator-(v1,_point);
    lVar1 = glm::vec<3,_float,_(glm::qualifier)0>::length();
    if ((double)lVar1 < 1e-10) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool containsValue(std::vector<glm::vec3>* _points, const glm::vec3& _point) {
    for (int i = 0; i < _points->size(); i++)
        if ((_points->at(i)-_point).length()<EPS )
            return true;   
    return false;
}